

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

char * __thiscall nuraft::buffer::get_str(buffer *this)

{
  uint uVar1;
  short sVar2;
  buffer *pbVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = *(uint *)this;
  uVar4 = (ulong)(uVar1 >> 0x10);
  if ((int)uVar1 < 0) {
    uVar4 = (ulong)*(uint *)(this + 4);
    uVar6 = uVar1 & 0x7fffffff;
    lVar9 = uVar4 + 8;
  }
  else {
    uVar6 = uVar1 & 0xffff;
    lVar9 = uVar4 + 4;
  }
  pbVar3 = this + lVar9;
  uVar8 = (ulong)uVar6;
  uVar10 = uVar8;
  if (uVar8 < uVar4) {
    uVar10 = uVar4;
  }
  iVar7 = -1;
  for (lVar9 = 0;
      (uVar5 = uVar10, uVar4 + lVar9 < uVar8 &&
      (uVar5 = uVar4 + lVar9, pbVar3[lVar9] != (buffer)0x0)); lVar9 = lVar9 + 1) {
    iVar7 = iVar7 + -1;
  }
  sVar2 = (short)(uVar1 >> 0x10);
  if (lVar9 == 0) {
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
    }
    else {
      *(short *)(this + 2) = sVar2 + 1;
    }
  }
  else if (uVar5 < uVar8) {
    if (-1 < (int)uVar1) {
      *(short *)(this + 2) = sVar2 - (short)iVar7;
      return (char *)pbVar3;
    }
    *(int *)(this + 4) = *(int *)(this + 4) - iVar7;
    return (char *)pbVar3;
  }
  return (char *)0x0;
}

Assistant:

size_t buffer::pos() const {
    return (size_t)( __pos_of_block(this) );
}